

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

uint32 __thiscall Clasp::SharedContext::defaultDomPref(SharedContext *this)

{
  uint n;
  Configuration *pCVar1;
  uint x;
  SolverParams *sp;
  uint local_14;
  undefined8 *puVar2;
  
  pCVar1 = SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject>::operator->
                     ((SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject> *)0x1d291a);
  n = (*pCVar1->_vptr_Configuration[6])(pCVar1,0);
  puVar2 = (undefined8 *)CONCAT44(x,n);
  if ((((uint)((ulong)*puVar2 >> 0x20) & 7) == 4) && (*(uint *)(puVar2 + 1) >> 0x1d != 0)) {
    local_14 = *(uint *)(puVar2 + 1) >> 0x18 & 0x1f;
  }
  else {
    local_14 = set_bit<unsigned_int>(x,n);
  }
  return local_14;
}

Assistant:

uint32 SharedContext::defaultDomPref() const {
	const SolverParams& sp = config_->solver(0);
	return sp.heuId == Heuristic_t::Domain && sp.heuristic.domMod != HeuParams::mod_none
		? sp.heuristic.domPref
		: set_bit(0u, 31);
}